

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_ASAi_bnd.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  double *__ptr;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  N_Vector uB;
  char *pcVar6;
  int iVar7;
  UserData data;
  long lVar8;
  long lVar9;
  int indexB;
  SUNContext sunctx;
  int ncheck;
  sunrealtype dy;
  sunrealtype dx;
  sunrealtype t;
  uint local_7c;
  undefined8 local_78;
  double local_70;
  double local_68;
  double local_60;
  uint local_54;
  double local_50;
  double local_48;
  undefined1 local_40 [8];
  long local_38;
  
  __ptr = (double *)malloc(0x28);
  if (__ptr == (double *)0x0) {
    main_cold_8();
    return 1;
  }
  *__ptr = 0.04878048780487805;
  __ptr[1] = 0.047619047619047616;
  *(undefined4 *)(__ptr + 2) = 0;
  *(undefined4 *)((long)__ptr + 0x14) = 0x407a4400;
  *(undefined4 *)(__ptr + 3) = 0;
  *(undefined4 *)((long)__ptr + 0x1c) = 0x402ec000;
  __ptr[4] = 441.00000000000006;
  uVar1 = SUNContext_Create(0,&local_78);
  if ((int)uVar1 < 0) {
    pcVar6 = "SUNContext_Create";
  }
  else {
    lVar2 = N_VNew_Serial(800,local_78);
    if (lVar2 == 0) {
      main_cold_7();
      return 1;
    }
    local_48 = *__ptr;
    local_50 = __ptr[1];
    lVar3 = N_VGetArrayPointer(lVar2);
    lVar8 = 1;
    do {
      local_68 = (double)(int)lVar8 * local_50;
      local_70 = 1.0 - local_68;
      iVar7 = 1;
      lVar9 = 0;
      do {
        dVar4 = (double)iVar7 * local_48;
        local_60 = (2.0 - dVar4) * dVar4 * local_68 * local_70;
        dVar4 = exp(dVar4 * 5.0 * local_68);
        *(double *)(lVar3 + lVar9) = dVar4 * local_60;
        lVar9 = lVar9 + 0xa0;
        iVar7 = iVar7 + 1;
      } while (lVar9 != 0x1900);
      lVar8 = lVar8 + 1;
      lVar3 = lVar3 + 8;
    } while (lVar8 != 0x15);
    puts("\nCreate and allocate CVODES memory for forward runs");
    lVar3 = CVodeCreate(2,local_78);
    local_38 = lVar3;
    if (lVar3 == 0) {
      main_cold_6();
      return 1;
    }
    uVar1 = CVodeSetUserData(lVar3,__ptr);
    if ((int)uVar1 < 0) {
      pcVar6 = "CVodeSetUserData";
    }
    else {
      uVar1 = CVodeInit(0,lVar3,f,lVar2);
      if ((int)uVar1 < 0) {
        pcVar6 = "CVodeInit";
      }
      else {
        uVar1 = CVodeSStolerances(0,0x3ee4f8b588e368f1,lVar3);
        if ((int)uVar1 < 0) {
          pcVar6 = "CVodeSStolerances";
        }
        else {
          dVar4 = (double)SUNBandMatrix(800,0x14,0x14,local_78);
          if (dVar4 == 0.0) {
            main_cold_5();
            return 1;
          }
          dVar5 = (double)SUNLinSol_Band(lVar2,dVar4,local_78);
          if (dVar5 == 0.0) {
            main_cold_4();
            return 1;
          }
          uVar1 = CVodeSetLinearSolver(lVar3,dVar5,dVar4);
          if ((int)uVar1 < 0) {
            pcVar6 = "CVodeSetLinearSolver";
          }
          else {
            uVar1 = CVodeSetJacFn(lVar3,Jac);
            if (-1 < (int)uVar1) {
              puts("\nAllocate global memory");
              uVar1 = CVodeAdjInit(lVar3,0x32,1);
              if ((int)uVar1 < 0) {
                pcVar6 = "CVodeAdjInit";
              }
              else {
                puts("\nForward integration");
                uVar1 = CVodeF(0,lVar3,lVar2,local_40,1,&local_54);
                if (-1 < (int)uVar1) {
                  local_60 = dVar5;
                  printf("\nncheck = %d\n",(ulong)local_54);
                  uB = (N_Vector)N_VNew_Serial(800,local_78);
                  if (uB == (N_Vector)0x0) {
                    main_cold_3();
                    return 1;
                  }
                  N_VConst(0,uB);
                  puts("\nCreate and allocate CVODES memory for backward run");
                  uVar1 = CVodeCreateB(lVar3,2,&local_7c);
                  if ((int)uVar1 < 0) {
                    pcVar6 = "CVodeCreateB";
                  }
                  else {
                    uVar1 = CVodeSetUserDataB(lVar3,local_7c,__ptr);
                    if ((int)uVar1 < 0) {
                      pcVar6 = "CVodeSetUserDataB";
                    }
                    else {
                      uVar1 = CVodeInitB(0,lVar3,local_7c,fB,uB);
                      if ((int)uVar1 < 0) {
                        pcVar6 = "CVodeInitB";
                      }
                      else {
                        uVar1 = CVodeSStolerancesB(0xa0b5ed8d,0x3ee4f8b588e368f1,lVar3,local_7c);
                        if ((int)uVar1 < 0) {
                          pcVar6 = "CVodeSStolerancesB";
                        }
                        else {
                          local_68 = dVar4;
                          lVar8 = SUNBandMatrix(800,0x14,0x14,local_78);
                          if (lVar8 == 0) {
                            main_cold_2();
                            return 1;
                          }
                          dVar4 = (double)SUNLinSol_Band(uB,lVar8,local_78);
                          if (dVar4 == 0.0) {
                            main_cold_1();
                            return 1;
                          }
                          uVar1 = CVodeSetLinearSolverB(lVar3,local_7c,dVar4,lVar8);
                          if ((int)uVar1 < 0) {
                            pcVar6 = "CVodeSetLinearSolverB";
                          }
                          else {
                            uVar1 = CVodeSetJacFnB(lVar3,local_7c,JacB);
                            if ((int)uVar1 < 0) {
                              pcVar6 = "CVodeSetJacFnB";
                            }
                            else {
                              local_70 = dVar4;
                              puts("\nBackward integration");
                              uVar1 = CVodeB(0,lVar3,1);
                              if ((int)uVar1 < 0) {
                                pcVar6 = "CVodeB";
                                goto LAB_00101b08;
                              }
                              data = (UserData)(ulong)local_7c;
                              uVar1 = CVodeGetB(lVar3,data,local_40,uB);
                              if (-1 < (int)uVar1) {
                                PrintOutput(uB,data);
                                N_VDestroy(lVar2);
                                N_VDestroy(uB);
                                CVodeFree(&local_38);
                                SUNLinSolFree(local_60);
                                SUNMatDestroy(local_68);
                                SUNLinSolFree(local_70);
                                SUNMatDestroy(lVar8);
                                free(__ptr);
                                SUNContext_Free(&local_78);
                                return 0;
                              }
                              pcVar6 = "CVodeGetB";
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_00101b2b;
                }
                pcVar6 = "CVodeF";
              }
LAB_00101b08:
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar6,
                      (ulong)uVar1);
              return 1;
            }
            pcVar6 = "CVodeSetJacFn";
          }
        }
      }
    }
  }
LAB_00101b2b:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar6,(ulong)uVar1);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  UserData data;

  void* cvode_mem;
  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;

  sunrealtype dx, dy, reltol, abstol, t;
  N_Vector u;

  int indexB;

  sunrealtype reltolB, abstolB;
  N_Vector uB;

  int retval, ncheck;

  data      = NULL;
  cvode_mem = NULL;
  u = uB = NULL;
  LS = LSB = NULL;
  A = AB = NULL;

  /* Allocate and initialize user data memory */

  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }

  dx = data->dx = XMAX / (MX + 1);
  dy = data->dy = YMAX / (MY + 1);
  data->hdcoef  = ONE / (dx * dx);
  data->hacoef  = SUN_RCONST(1.5) / (TWO * dx);
  data->vdcoef  = ONE / (dy * dy);

  /* Set the tolerances for the forward integration */
  reltol = ZERO;
  abstol = ATOL;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate u vector */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew", 0)) { return (1); }

  /* Initialize u vector */
  SetIC(u, data);

  /* Create and allocate CVODES memory for forward run */

  printf("\nCreate and allocate CVODES memory for forward runs\n");

  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create banded SUNMatrix for the forward problem */
  A = SUNBandMatrix(NEQ, MY, MY, sunctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver for the forward problem */
  LS = SUNLinSol_Band(u, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine for the forward problem */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Allocate global memory */

  printf("\nAllocate global memory\n");

  retval = CVodeAdjInit(cvode_mem, NSTEP, CV_HERMITE);
  if (check_retval(&retval, "CVodeAdjInit", 1)) { return (1); }

  /* Perform forward run */
  printf("\nForward integration\n");
  retval = CVodeF(cvode_mem, TOUT, u, &t, CV_NORMAL, &ncheck);
  if (check_retval(&retval, "CVodeF", 1)) { return (1); }

  printf("\nncheck = %d\n", ncheck);

  /* Set the tolerances for the backward integration */
  reltolB = RTOLB;
  abstolB = ATOL;

  /* Allocate uB */
  uB = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)uB, "N_VNew", 0)) { return (1); }
  /* Initialize uB = 0 */
  N_VConst(ZERO, uB);

  /* Create and allocate CVODES memory for backward run */

  printf("\nCreate and allocate CVODES memory for backward run\n");

  retval = CVodeCreateB(cvode_mem, CV_BDF, &indexB);
  if (check_retval(&retval, "CVodeCreateB", 1)) { return (1); }

  retval = CVodeSetUserDataB(cvode_mem, indexB, data);
  if (check_retval(&retval, "CVodeSetUserDataB", 1)) { return (1); }

  retval = CVodeInitB(cvode_mem, indexB, fB, TOUT, uB);
  if (check_retval(&retval, "CVodeInitB", 1)) { return (1); }

  retval = CVodeSStolerancesB(cvode_mem, indexB, reltolB, abstolB);
  if (check_retval(&retval, "CVodeSStolerancesB", 1)) { return (1); }

  /* Create banded SUNMatrix for the backward problem */
  AB = SUNBandMatrix(NEQ, MY, MY, sunctx);
  if (check_retval((void*)AB, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver for the backward problem */
  LSB = SUNLinSol_Band(uB, AB, sunctx);
  if (check_retval((void*)LSB, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolverB(cvode_mem, indexB, LSB, AB);
  if (check_retval(&retval, "CVodeSetLinearSolverB", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine for the backward problem */
  retval = CVodeSetJacFnB(cvode_mem, indexB, JacB);
  if (check_retval(&retval, "CVodeSetJacFnB", 1)) { return (1); }

  /* Perform backward integration */
  printf("\nBackward integration\n");
  retval = CVodeB(cvode_mem, T0, CV_NORMAL);
  if (check_retval(&retval, "CVodeB", 1)) { return (1); }

  retval = CVodeGetB(cvode_mem, indexB, &t, uB);
  if (check_retval(&retval, "CVodeGetB", 1)) { return (1); }

  PrintOutput(uB, data);

  N_VDestroy(u);            /* Free the u vector                      */
  N_VDestroy(uB);           /* Free the uB vector                     */
  CVodeFree(&cvode_mem);    /* Free the CVODE problem memory          */
  SUNLinSolFree(LS);        /* Free the forward linear solver memory  */
  SUNMatDestroy(A);         /* Free the forward matrix memory         */
  SUNLinSolFree(LSB);       /* Free the backward linear solver memory */
  SUNMatDestroy(AB);        /* Free the backward matrix memory        */
  free(data);               /* Free the user data */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS simulation context */

  return (0);
}